

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::ChNodeFEAxyzDDD(ChNodeFEAxyzDDD *this,ChNodeFEAxyzDDD *other)

{
  ChVariablesGenericDiagonalMass *this_00;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x1d8);
  *(undefined ***)
   &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    field_0x18 = &PTR__ChLoadable_011504f8;
  ChNodeFEAxyzDD::ChNodeFEAxyzDD
            (&this->super_ChNodeFEAxyzDD,&PTR_construction_vtable_32__0117b8d8,
             &other->super_ChNodeFEAxyzDD);
  (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
  _vptr_ChNodeFEAbase = (_func_int **)0x117b478;
  *(undefined8 *)&this->field_0x1d8 = 0x117b818;
  *(undefined8 *)
   &(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    field_0x18 = 0x117b678;
  (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
  super_ChVariableTupleCarrier_1vars<3>._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x2e8);
  (this->DDD_dtdt).m_data[2] = 0.0;
  *(undefined8 *)&(this->super_ChNodeFEAxyzDD).field_0x190 = 0;
  *(undefined8 *)&this->field_0x198 = 0;
  *(undefined8 *)&this->field_0x1a0 = 0;
  (this->DDD_dt).m_data[0] = 0.0;
  (this->DDD_dt).m_data[1] = 0.0;
  (this->DDD_dt).m_data[2] = 0.0;
  (this->DDD_dtdt).m_data[0] = 0.0;
  (this->DDD_dtdt).m_data[1] = 0.0;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyzDD).field_0x188 = this_00;
  ChVariablesGenericDiagonalMass::operator=
            (this_00,*(ChVariablesGenericDiagonalMass **)&(other->super_ChNodeFEAxyzDD).field_0x188)
  ;
  if (other != this) {
    *(undefined8 *)&(this->super_ChNodeFEAxyzDD).field_0x190 =
         *(undefined8 *)&(other->super_ChNodeFEAxyzDD).field_0x190;
    *(undefined8 *)&this->field_0x198 = *(undefined8 *)&other->field_0x198;
    *(undefined8 *)&this->field_0x1a0 = *(undefined8 *)&other->field_0x1a0;
    (this->DDD_dt).m_data[0] = (other->DDD_dt).m_data[0];
    (this->DDD_dt).m_data[1] = (other->DDD_dt).m_data[1];
    (this->DDD_dt).m_data[2] = (other->DDD_dt).m_data[2];
    (this->DDD_dtdt).m_data[0] = (other->DDD_dtdt).m_data[0];
    (this->DDD_dtdt).m_data[1] = (other->DDD_dtdt).m_data[1];
    (this->DDD_dtdt).m_data[2] = (other->DDD_dtdt).m_data[2];
  }
  return;
}

Assistant:

ChNodeFEAxyzDDD::ChNodeFEAxyzDDD(const ChNodeFEAxyzDDD& other) : ChNodeFEAxyzDD(other) {
    variables_DDD = new ChVariablesGenericDiagonalMass(3);
    (*variables_DDD) = (*other.variables_DDD);
    DDD = other.DDD;
    DDD_dt = other.DDD_dt;
    DDD_dtdt = other.DDD_dtdt;
}